

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_ManSaveCuts(Mf_Man_t *p,Mf_Cut_t **pCuts,int nCuts)

{
  int iVar1;
  int iVar2;
  void *Entry;
  int *piVar3;
  int local_30;
  int nInts;
  int iCur;
  int *pPlace;
  int i;
  int nCuts_local;
  Mf_Cut_t **pCuts_local;
  Mf_Man_t *p_local;
  
  local_30 = 1;
  for (pPlace._0_4_ = 0; (int)pPlace < nCuts; pPlace._0_4_ = (int)pPlace + 1) {
    local_30 = (*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b) + 1 + local_30;
  }
  if (0xffff < (int)((p->iCur & 0xffffU) + local_30)) {
    p->iCur = ((p->iCur >> 0x10) + 1) * 0x10000;
  }
  iVar1 = Vec_PtrSize(&p->vPages);
  if (iVar1 == p->iCur >> 0x10) {
    Entry = malloc(0x40000);
    Vec_PtrPush(&p->vPages,Entry);
  }
  iVar1 = p->iCur;
  p->iCur = local_30 + p->iCur;
  piVar3 = Mf_ManCutSet(p,iVar1);
  _nInts = piVar3 + 1;
  *piVar3 = nCuts;
  for (pPlace._0_4_ = 0; (int)pPlace < nCuts; pPlace._0_4_ = (int)pPlace + 1) {
    iVar2 = Mf_CutSetBoth(*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b,
                          *(uint *)&pCuts[(int)pPlace]->field_0x10 & 0x7ffffff);
    *_nInts = iVar2;
    memcpy(_nInts + 1,pCuts[(int)pPlace]->pLeaves,
           (ulong)(*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b) << 2);
    _nInts = _nInts + 1 + (int)(*(uint *)&pCuts[(int)pPlace]->field_0x10 >> 0x1b);
  }
  return iVar1;
}

Assistant:

static inline int Mf_ManSaveCuts( Mf_Man_t * p, Mf_Cut_t ** pCuts, int nCuts )
{
    int i, * pPlace, iCur, nInts = 1;
    for ( i = 0; i < nCuts; i++ )
        nInts += pCuts[i]->nLeaves + 1;
    if ( (p->iCur & 0xFFFF) + nInts > 0xFFFF )
        p->iCur = ((p->iCur >> 16) + 1) << 16;
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> 16) )
        Vec_PtrPush( &p->vPages, ABC_ALLOC(int, (1<<16)) );
    iCur = p->iCur; p->iCur += nInts;
    pPlace = Mf_ManCutSet( p, iCur );
    *pPlace++ = nCuts;
    for ( i = 0; i < nCuts; i++ )
    {
        *pPlace++ = Mf_CutSetBoth(pCuts[i]->nLeaves, pCuts[i]->iFunc);
        memcpy( pPlace, pCuts[i]->pLeaves, sizeof(int) * pCuts[i]->nLeaves );
        pPlace += pCuts[i]->nLeaves;
    }
    return iCur;
}